

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O1

bool comparesEqual(QString *lhs,char *rhs)

{
  long lVar1;
  int iVar2;
  long lVar3;
  QChar *pQVar4;
  long lVar5;
  
  if (rhs == (char *)0x0) {
    lVar5 = 0;
  }
  else {
    lVar3 = -1;
    do {
      lVar5 = lVar3 + 1;
      lVar1 = lVar3 + 1;
      lVar3 = lVar5;
    } while (rhs[lVar1] != '\0');
  }
  pQVar4 = (QChar *)(lhs->d).ptr;
  if (pQVar4 == (QChar *)0x0) {
    pQVar4 = (QChar *)&QString::_empty;
  }
  iVar2 = QString::compare_helper(pQVar4,(lhs->d).size,rhs,lVar5,CaseSensitive);
  return iVar2 == 0;
}

Assistant:

bool comparesEqual(const QString &lhs, const char *rhs) noexcept
    { return comparesEqual(lhs, QByteArrayView(rhs)); }